

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.c
# Opt level: O0

int nni_plat_cv_until(nni_plat_cv *cv,nni_time until)

{
  int iVar1;
  undefined1 local_28 [8];
  timespec ts;
  nni_time until_local;
  nni_plat_cv *cv_local;
  
  local_28 = (undefined1  [8])(until / 1000);
  ts.tv_sec = (until % 1000) * 1000000;
  ts.tv_nsec = until;
  iVar1 = nni_pthread_cond_timedwait(&cv->cv,cv->mtx,(timespec *)local_28);
  return iVar1;
}

Assistant:

int
nni_plat_cv_until(nni_plat_cv *cv, nni_time until)
{
	struct timespec ts;

	// Our caller has already guaranteed a sane value for until.
	ts.tv_sec  = until / 1000;
	ts.tv_nsec = (until % 1000) * 1000000;

	return (nni_pthread_cond_timedwait(&cv->cv, cv->mtx, &ts));
}